

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
::find_or_prepare_insert<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  bool bVar5;
  long lVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  char cVar15;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  undefined1 auVar16 [16];
  pair<unsigned_long,_bool> pVar32;
  __m128i match;
  long local_a8;
  size_t local_a0;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::shared_ptr<cs::name_space>_&>_>
  local_78;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  size_t local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar2 = *(ulong *)(this + 0x18);
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar9 = hashval >> 7 & uVar2;
  auVar14 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar14 = pshuflw(auVar14,auVar14,0);
  local_48 = auVar14._0_4_;
  local_a8 = 0;
  local_50 = hashval;
  uStack_44 = local_48;
  uStack_40 = local_48;
  uStack_3c = local_48;
  do {
    pcVar1 = (char *)(*(long *)this + uVar9);
    cVar15 = *pcVar1;
    cVar17 = pcVar1[1];
    cVar18 = pcVar1[2];
    cVar19 = pcVar1[3];
    cVar20 = pcVar1[4];
    cVar21 = pcVar1[5];
    cVar22 = pcVar1[6];
    cVar23 = pcVar1[7];
    cVar24 = pcVar1[8];
    cVar25 = pcVar1[9];
    cVar26 = pcVar1[10];
    cVar27 = pcVar1[0xb];
    cVar28 = pcVar1[0xc];
    cVar29 = pcVar1[0xd];
    cVar30 = pcVar1[0xe];
    cVar31 = pcVar1[0xf];
    auVar14[0] = -((char)local_48 == cVar15);
    auVar14[1] = -(local_48._1_1_ == cVar17);
    auVar14[2] = -(local_48._2_1_ == cVar18);
    auVar14[3] = -(local_48._3_1_ == cVar19);
    auVar14[4] = -((char)uStack_44 == cVar20);
    auVar14[5] = -(uStack_44._1_1_ == cVar21);
    auVar14[6] = -(uStack_44._2_1_ == cVar22);
    auVar14[7] = -(uStack_44._3_1_ == cVar23);
    auVar14[8] = -((char)uStack_40 == cVar24);
    auVar14[9] = -(uStack_40._1_1_ == cVar25);
    auVar14[10] = -(uStack_40._2_1_ == cVar26);
    auVar14[0xb] = -(uStack_40._3_1_ == cVar27);
    auVar14[0xc] = -((char)uStack_3c == cVar28);
    auVar14[0xd] = -(uStack_3c._1_1_ == cVar29);
    auVar14[0xe] = -(uStack_3c._2_1_ == cVar30);
    auVar14[0xf] = -(uStack_3c._3_1_ == cVar31);
    uVar4 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf;
    bVar13 = uVar4 == 0;
    iVar12 = 4;
    if (!bVar13) {
      uVar11 = (uint)uVar4;
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      lVar10 = *(long *)(this + 8);
      local_68 = cVar15;
      cStack_67 = cVar17;
      cStack_66 = cVar18;
      cStack_65 = cVar19;
      cStack_64 = cVar20;
      cStack_63 = cVar21;
      cStack_62 = cVar22;
      cStack_61 = cVar23;
      cStack_60 = cVar24;
      cStack_5f = cVar25;
      cStack_5e = cVar26;
      cStack_5d = cVar27;
      cStack_5c = cVar28;
      cStack_5b = cVar29;
      cStack_5a = cVar30;
      cStack_59 = cVar31;
      while( true ) {
        uVar8 = uVar3 + uVar9 & uVar2;
        lVar6 = uVar8 * 0x30;
        local_78.first.
        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        .
        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        ._M_head_impl =
             (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              )(lVar10 + lVar6);
        local_78.second.super__Tuple_impl<0UL,_const_std::shared_ptr<cs::name_space>_&>.
        super__Head_base<0UL,_const_std::shared_ptr<cs::name_space>_&,_false>._M_head_impl =
             (_Tuple_impl<0UL,_const_std::shared_ptr<cs::name_space>_&>)(lVar10 + lVar6 + 0x20);
        local_88.rhs = key;
        local_88.eq = (key_equal *)(this + 0x28);
        bVar5 = memory_internal::
                DecomposePairImpl<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<std::shared_ptr<cs::name_space>const&>>
                          (&local_88,&local_78);
        cVar15 = local_68;
        cVar17 = cStack_67;
        cVar18 = cStack_66;
        cVar19 = cStack_65;
        cVar20 = cStack_64;
        cVar21 = cStack_63;
        cVar22 = cStack_62;
        cVar23 = cStack_61;
        cVar24 = cStack_60;
        cVar25 = cStack_5f;
        cVar26 = cStack_5e;
        cVar27 = cStack_5d;
        cVar28 = cStack_5c;
        cVar29 = cStack_5b;
        cVar30 = cStack_5a;
        cVar31 = cStack_59;
        if (bVar5) break;
        uVar11 = uVar11 - 1 & uVar11;
        bVar13 = uVar11 == 0;
        iVar12 = 4;
        if (bVar13) goto LAB_0015f540;
        uVar3 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        lVar10 = *(long *)(this + 8);
      }
      iVar12 = 1;
      local_a0 = uVar8;
    }
LAB_0015f540:
    if (bVar13) {
      auVar16[0] = -(cVar15 == -0x80);
      auVar16[1] = -(cVar17 == -0x80);
      auVar16[2] = -(cVar18 == -0x80);
      auVar16[3] = -(cVar19 == -0x80);
      auVar16[4] = -(cVar20 == -0x80);
      auVar16[5] = -(cVar21 == -0x80);
      auVar16[6] = -(cVar22 == -0x80);
      auVar16[7] = -(cVar23 == -0x80);
      auVar16[8] = -(cVar24 == -0x80);
      auVar16[9] = -(cVar25 == -0x80);
      auVar16[10] = -(cVar26 == -0x80);
      auVar16[0xb] = -(cVar27 == -0x80);
      auVar16[0xc] = -(cVar28 == -0x80);
      auVar16[0xd] = -(cVar29 == -0x80);
      auVar16[0xe] = -(cVar30 == -0x80);
      auVar16[0xf] = -(cVar31 == -0x80);
      iVar12 = 3;
      if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar16 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar16 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar16 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar16 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar16 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar16 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar16 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar16 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar16 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar16 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar16 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar16 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar16[0xf])
      {
        lVar10 = uVar9 + local_a8;
        local_a8 = local_a8 + 0x10;
        uVar9 = lVar10 + 0x10U & uVar2;
        iVar12 = 0;
      }
    }
    if (iVar12 != 0) {
      if (iVar12 == 3) {
        local_a0 = raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                   ::prepare_insert((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                                     *)this,local_50);
        uVar7 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      }
      else {
        uVar7 = 0;
      }
      pVar32._8_8_ = uVar7;
      pVar32.first = local_a0;
      return pVar32;
    }
  } while( true );
}

Assistant:

std::pair<size_t, bool> find_or_prepare_insert(const K& key, size_t hashval)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
							return {seq.offset((size_t)i), false};
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
					seq.next();
				}
				return {prepare_insert(hashval), true};
			}